

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_fall_off_cliff(player *p)

{
  short sVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  feature *pfVar6;
  level_conflict *plVar7;
  level_conflict *plVar8;
  int iVar9;
  
  plVar8 = world->levels;
  sVar1 = p->place;
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  pfVar6 = square_feat(cave,grid);
  msg(pfVar6->hurt_msg);
  p->last_place = p->place;
  if (plVar8[sVar1].locality == LOC_MOUNTAIN_TOP) {
    plVar8 = level_by_name(world,plVar8[sVar1].down);
    player_change_place(p,plVar8->index);
    _Var2 = player_of_has(p,L'\v');
    iVar9 = 4;
    if (_Var2) {
      equip_learn_flag(p,L'\v');
      iVar9 = 2;
    }
    wVar3 = damroll(iVar9,8);
    wVar4 = damroll(iVar9,8);
    player_inc_timed(p,L'\t',wVar4,true,true,true);
    wVar4 = damroll(iVar9,8);
    player_inc_timed(p,L'\b',wVar4,true,true,true);
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    pfVar6 = square_feat(cave,grid_01);
    take_hit(p,wVar3,pfVar6->die_msg);
    return;
  }
  if (plVar8[sVar1].locality == LOC_NAN_DUNGORTHEB) {
    do {
      if (world->levels[p->place].south == (char *)0x0) {
        return;
      }
      plVar7 = level_by_name(world,plVar8[sVar1].south);
      player_change_place(p,plVar7->index);
      _Var2 = player_of_has(p,L'\v');
      iVar9 = 4;
      if (_Var2) {
        equip_learn_flag(p,L'\v');
        iVar9 = 2;
      }
      wVar3 = damroll(iVar9,8);
      wVar4 = damroll(iVar9,8);
      player_inc_timed(p,L'\t',wVar4,true,true,true);
      wVar4 = damroll(iVar9,8);
      player_inc_timed(p,L'\b',wVar4,true,true,true);
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      pfVar6 = square_feat(cave,grid_00);
      take_hit(p,wVar3,pfVar6->die_msg);
      uVar5 = Rand_div(3);
    } while ((int)uVar5 < 1);
  }
  return;
}

Assistant:

void player_fall_off_cliff(struct player *p)
{
	int i, dam;
	struct level *lev = &world->levels[p->place];

	msg(square_feat(cave, p->grid)->hurt_msg);

	/* Where we fell from */
	p->last_place = p->place;

	/* From the mountaintop, or down Nan Dungortheb */
	if (lev->locality == LOC_MOUNTAIN_TOP) {
		player_change_place(p, level_by_name(world, lev->down)->index);

		if (player_of_has(p, OF_FEATHER)) {
			equip_learn_flag(p, OF_FEATHER);
			dam = damroll(2, 8);
			(void) player_inc_timed(p, TMD_STUN, damroll(2, 8), true, true,
									true);
			(void) player_inc_timed(p, TMD_CUT, damroll(2, 8), true, true,
									true);
		} else {
			dam = damroll(4, 8);
			(void) player_inc_timed(p, TMD_STUN, damroll(4, 8), true, true,
									true);
			(void) player_inc_timed(p, TMD_CUT, damroll(4, 8), true, true,
									true);
		}
		take_hit(p, dam, square_feat(cave, p->grid)->die_msg);
	} else if (lev->locality == LOC_NAN_DUNGORTHEB) {
		/* Fall at least one level */
		for (i = 0; i < 1; i = randint0(3)) {
			/* Check we haven't come to the end */
			if (!world->levels[p->place].south) break;

			player_change_place(p, level_by_name(world, lev->south)->index);

			if (player_of_has(p, OF_FEATHER)) {
				equip_learn_flag(p, OF_FEATHER);
				dam = damroll(2, 8);
				(void) player_inc_timed(p, TMD_STUN, damroll(2, 8), true, true,
										true);
				(void) player_inc_timed(p, TMD_CUT, damroll(2, 8), true, true,
										true);
			} else {
				dam = damroll(4, 8);
				(void) player_inc_timed(p, TMD_STUN, damroll(4, 8), true, true,
										true);
				(void) player_inc_timed(p, TMD_CUT, damroll(4, 8), true, true,
										true);
			}
			take_hit(p, dam, square_feat(cave, p->grid)->die_msg);
		}
	}
}